

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2l(char *cval,int *lval,int *status)

{
  double *in_RDX;
  undefined4 *in_RSI;
  char *in_RDI;
  double dval;
  long ival;
  char msg [81];
  char sval [81];
  char dtype;
  char *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  long *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff40;
  char local_21;
  int local_4;
  
  if (*(int *)in_RDX < 1) {
    if (*in_RDI == '\0') {
      *(undefined4 *)in_RDX = 0xcc;
      local_4 = 0xcc;
    }
    else {
      ffc2x(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
            in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_RDX,in_stack_ffffffffffffff40);
      if ((local_21 == 'C') || (local_21 == 'X')) {
        *(undefined4 *)in_RDX = 0x194;
      }
      if (*(int *)in_RDX < 1) {
        if (local_21 == 'I') {
          if (in_stack_ffffffffffffff20 == (long *)0x0) {
            *in_RSI = 0;
          }
          else {
            *in_RSI = 1;
          }
        }
        else if (local_21 == 'F') {
          if (((double)in_stack_ffffffffffffff18 != 0.0) || (NAN((double)in_stack_ffffffffffffff18))
             ) {
            *in_RSI = 1;
          }
          else {
            *in_RSI = 0;
          }
        }
        local_4 = *(int *)in_RDX;
      }
      else {
        *in_RSI = 0;
        strcpy(&stack0xffffffffffffff28,"Error in ffc2l evaluating string as a logical: ");
        strncat(&stack0xffffffffffffff28,in_RDI,0x1e);
        ffpmsg((char *)0x17f780);
        local_4 = *(int *)in_RDX;
      }
    }
  }
  else {
    local_4 = *(int *)in_RDX;
  }
  return local_4;
}

Assistant:

int ffc2l(const char *cval,  /* I - string representation of the value */
         int *lval,          /* O - numerical value of the input string */
         int *status)        /* IO - error status */
/*
  convert formatted string to a logical value, doing implicit
  datatype conversion if necessary
*/
{
    char dtype, sval[81], msg[81];
    long ival;
    double dval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */

    /* convert the keyword to its native datatype */
    ffc2x(cval, &dtype, &ival, lval, sval, &dval, status);

    if (dtype == 'C' || dtype == 'X' )
        *status = BAD_LOGICALKEY;

    if (*status > 0)
    {
            *lval = 0;
            strcpy(msg,"Error in ffc2l evaluating string as a logical: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }

    if (dtype == 'I')
    {
        if (ival)
            *lval = 1;
        else
            *lval = 0;
    }
    else if (dtype == 'F')
    {
        if (dval)
            *lval = 1;
        else
            *lval = 0;
    }

    return(*status);
}